

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O2

REF_STATUS ref_migrate_replicate_ghost(REF_GRID ref_grid)

{
  int iVar1;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  uint uVar2;
  REF_STATUS RVar3;
  void *pvVar4;
  undefined8 uVar5;
  ulong uVar6;
  long lVar7;
  REF_MPI ref_mpi;
  int iVar8;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  REF_INT *local_00;
  REF_INT ncell;
  void *local_d8;
  REF_INT local;
  REF_GRID local_c8;
  REF_MPI local_c0;
  long local_b8;
  REF_INT new_cell;
  REF_INT nodes [27];
  
  ref_mpi = ref_grid->mpi;
  ref_node = ref_grid->node;
  uVar2 = ref_node_synchronize_globals(ref_node);
  if (uVar2 == 0) {
    if (ref_mpi->n < 2) {
      return 0;
    }
    if (ref_mpi->id != 0) {
      for (lVar7 = 0; lVar7 < ref_node->old_n_global; lVar7 = lVar7 + 1) {
        uVar2 = ref_node_add(ref_node,lVar7,&local);
        if (uVar2 != 0) {
          uVar6 = (ulong)uVar2;
          pcVar11 = "new_node";
          uVar5 = 0x706;
          goto LAB_001ffdba;
        }
        ref_node->part[local] = 0;
      }
    }
    uVar2 = ref_node_ghost_real(ref_node);
    if (uVar2 == 0) {
      uVar2 = ref_geom_ghost(ref_grid->geom,ref_node);
      if (uVar2 == 0) {
        local_b8 = 0;
        local_c8 = ref_grid;
        do {
          if (local_b8 == 0x10) {
            return 0;
          }
          ref_cell = local_c8->cell[local_b8];
          if (ref_mpi->id == 0) {
            ncell = ref_cell->n;
            uVar2 = ref_mpi_bcast(ref_mpi,&ncell,1,1);
            if (uVar2 != 0) {
              pcVar11 = "bcast";
              uVar5 = 0x711;
              goto LAB_00200152;
            }
            uVar2 = ncell * ref_cell->size_per;
            if ((int)uVar2 < 0) {
              uVar5 = 0x712;
              goto LAB_00200276;
            }
            pvVar4 = malloc((ulong)uVar2 << 3);
            if (pvVar4 == (void *)0x0) {
              uVar5 = 0x712;
              goto LAB_002002a3;
            }
            ncell = 0;
            local_d8 = pvVar4;
            for (iVar8 = 0; iVar8 < ref_cell->max; iVar8 = iVar8 + 1) {
              RVar3 = ref_cell_nodes(ref_cell,iVar8,nodes);
              lVar7 = -1;
              if (RVar3 == 0) {
                uVar2 = ref_cell->node_per;
                uVar6 = 0;
                if (0 < (int)uVar2) {
                  uVar6 = (ulong)uVar2;
                }
                for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
                  iVar1 = nodes[uVar9];
                  lVar10 = lVar7;
                  if (((-1 < (long)iVar1) && (iVar1 < ref_node->max)) &&
                     (lVar10 = ref_node->global[iVar1], ref_node->global[iVar1] < 0)) {
                    lVar10 = lVar7;
                  }
                  *(long *)((long)local_d8 + ((long)ref_cell->size_per * (long)ncell + uVar9) * 8) =
                       lVar10;
                }
                if (ref_cell->last_node_is_an_id != 0) {
                  *(long *)((long)local_d8 + (long)(int)(ref_cell->size_per * ncell + uVar2) * 8) =
                       (long)nodes[(int)uVar2];
                }
                ncell = ncell + 1;
              }
            }
            if (ncell != ref_cell->n) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                     ,0x721,"ref_migrate_replicate_ghost","ncell miscount",(long)ncell,
                     (long)ref_cell->n);
              return 1;
            }
            uVar2 = ref_mpi_bcast(ref_mpi,local_d8,ncell * ref_cell->size_per,2);
            if (uVar2 != 0) {
              pcVar11 = "bcast";
              uVar5 = 0x724;
              goto LAB_00200152;
            }
          }
          else {
            uVar2 = ref_mpi_bcast(ref_mpi,&ncell,1,1);
            if (uVar2 != 0) {
              pcVar11 = "bcast";
              uVar5 = 0x727;
LAB_00200152:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                     ,uVar5,"ref_migrate_replicate_ghost",(ulong)uVar2,pcVar11);
              return uVar2;
            }
            uVar2 = ncell * ref_cell->size_per;
            if ((int)uVar2 < 0) {
              uVar5 = 0x728;
LAB_00200276:
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                     ,uVar5,"ref_migrate_replicate_ghost","malloc c2n of REF_GLOB negative");
              return 1;
            }
            pvVar4 = malloc((ulong)uVar2 << 3);
            if (pvVar4 == (void *)0x0) {
              uVar5 = 0x728;
LAB_002002a3:
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                     ,uVar5,"ref_migrate_replicate_ghost","malloc c2n of REF_GLOB NULL");
              return 2;
            }
            local_d8 = pvVar4;
            uVar2 = ref_mpi_bcast(ref_mpi,pvVar4,uVar2,2);
            if (uVar2 != 0) {
              pcVar11 = "bcast";
              uVar5 = 0x72b;
              goto LAB_00200152;
            }
            iVar8 = 0;
            local_c0 = ref_mpi;
            while (ref_mpi = local_c0, iVar8 < ncell) {
              local_00 = nodes;
              lVar7 = 0;
              while( true ) {
                iVar1 = ref_cell->node_per;
                if (iVar1 <= lVar7) break;
                uVar2 = ref_node_local(ref_node,*(REF_GLOB *)
                                                 ((long)local_d8 +
                                                 ((long)iVar8 * (long)ref_cell->size_per + lVar7) *
                                                 8),local_00);
                lVar7 = lVar7 + 1;
                local_00 = local_00 + 1;
                if (uVar2 != 0) {
                  pcVar11 = "g2l";
                  uVar5 = 0x732;
                  goto LAB_00200152;
                }
              }
              if (ref_cell->last_node_is_an_id != 0) {
                nodes[iVar1] = *(REF_INT *)
                                ((long)local_d8 + (long)(ref_cell->size_per * iVar8 + iVar1) * 8);
              }
              uVar2 = ref_cell_add(ref_cell,nodes,&new_cell);
              iVar8 = iVar8 + 1;
              if (uVar2 != 0) {
                pcVar11 = "add cell";
                uVar5 = 0x739;
                goto LAB_00200152;
              }
            }
          }
          free(local_d8);
          local_b8 = local_b8 + 1;
        } while( true );
      }
      uVar6 = (ulong)uVar2;
      pcVar11 = "ghost geom";
      uVar5 = 0x70c;
    }
    else {
      uVar6 = (ulong)uVar2;
      pcVar11 = "ghost real";
      uVar5 = 0x70b;
    }
  }
  else {
    uVar6 = (ulong)uVar2;
    pcVar11 = "sync global nodes";
    uVar5 = 0x700;
  }
LAB_001ffdba:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",uVar5,
         "ref_migrate_replicate_ghost",uVar6,pcVar11);
  return (REF_STATUS)uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_replicate_ghost(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GLOB global;
  REF_INT local;
  REF_INT group, ncell, cell, new_cell, cell_node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_CELL ref_cell;
  REF_GLOB *c2n;

  RSS(ref_node_synchronize_globals(ref_node), "sync global nodes");

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  if (!ref_mpi_once(ref_mpi)) {
    for (global = 0; global < ref_node_n_global(ref_node); global++) {
      RSS(ref_node_add(ref_node, global, &local), "new_node");
      ref_node_part(ref_node, local) = 0;
    }
  }

  RSS(ref_node_ghost_real(ref_node), "ghost real");
  RSS(ref_geom_ghost(ref_grid_geom(ref_grid), ref_node), "ghost geom");

  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    if (ref_mpi_once(ref_mpi)) {
      ncell = ref_cell_n(ref_cell);
      RSS(ref_mpi_bcast(ref_mpi, &ncell, 1, REF_INT_TYPE), "bcast");
      ref_malloc(c2n, ref_cell_size_per(ref_cell) * ncell, REF_GLOB);
      ncell = 0;
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell);
             cell_node++) {
          c2n[cell_node + ref_cell_size_per(ref_cell) * ncell] =
              ref_node_global(ref_node, nodes[cell_node]);
        }
        if (ref_cell_last_node_is_an_id(ref_cell)) {
          c2n[ref_cell_id_index(ref_cell) +
              ref_cell_size_per(ref_cell) * ncell] =
              (REF_GLOB)nodes[ref_cell_id_index(ref_cell)];
        }
        ncell++;
      }
      REIS(ncell, ref_cell_n(ref_cell), "ncell miscount");
      RSS(ref_mpi_bcast(ref_mpi, c2n, ncell * ref_cell_size_per(ref_cell),
                        REF_GLOB_TYPE),
          "bcast");
      ref_free(c2n);
    } else {
      RSS(ref_mpi_bcast(ref_mpi, &ncell, 1, REF_INT_TYPE), "bcast");
      ref_malloc(c2n, ref_cell_size_per(ref_cell) * ncell, REF_GLOB);
      RSS(ref_mpi_bcast(ref_mpi, c2n, ncell * ref_cell_size_per(ref_cell),
                        REF_GLOB_TYPE),
          "bcast");
      for (cell = 0; cell < ncell; cell++) {
        for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell);
             cell_node++) {
          RSS(ref_node_local(
                  ref_node, c2n[cell_node + cell * ref_cell_size_per(ref_cell)],
                  &(nodes[cell_node])),
              "g2l");
        }
        if (ref_cell_last_node_is_an_id(ref_cell)) {
          nodes[ref_cell_id_index(ref_cell)] =
              (REF_INT)c2n[ref_cell_id_index(ref_cell) +
                           ref_cell_size_per(ref_cell) * cell];
        }
        RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add cell");
      }
      ref_free(c2n);
    }
  }

  return REF_SUCCESS;
}